

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O0

void qDrawShadePanel(QPainter *p,QRect *r,QPalette *pal,bool sunken,int lineWidth,QBrush *fill)

{
  int iVar1;
  undefined1 in_CL;
  undefined8 in_RDX;
  QPainter *in_RSI;
  int in_R8D;
  QPalette *in_R9;
  int in_stack_000000f8;
  QBrush *in_stack_00000100;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined3 in_stack_ffffffffffffffe4;
  uint w;
  undefined1 sunken_00;
  
  w = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  QRect::x((QRect *)0x3fa78d);
  QRect::y((QRect *)0x3fa79b);
  iVar1 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  sunken_00 = (undefined1)((uint)iVar1 >> 0x18);
  QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  qDrawShadePanel(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,w,in_R8D,in_R9,(bool)sunken_00,
                  in_stack_000000f8,in_stack_00000100);
  return;
}

Assistant:

void qDrawShadePanel(QPainter *p, const QRect &r,
                      const QPalette &pal, bool sunken,
                      int lineWidth, const QBrush *fill)
{
    qDrawShadePanel(p, r.x(), r.y(), r.width(), r.height(), pal, sunken,
                     lineWidth, fill);
}